

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# endpoint.cpp
# Opt level: O3

void ssllabs::Endpoint::parseEndpointData
               (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                *obj,labsEndpoint_t *endpoint)

{
  ushort uVar1;
  char *pcVar2;
  ConstObject CVar3;
  Number NVar4;
  Type pGVar5;
  Ch *pCVar6;
  ConstObject local_30;
  
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  FindMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              *)&local_30,(Ch *)obj);
  CVar3.value_ = (ValueType *)local_30;
  NVar4.i = (I)rapidjson::
               GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               ::MemberEnd(obj);
  if (CVar3.value_ != (ValueType *)NVar4.i64) {
    pGVar5 = rapidjson::
             GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
             ::operator[]<char_const>
                       ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                         *)obj,"ipAddress");
    if ((undefined1  [16])((undefined1  [16])pGVar5->data_ & (undefined1  [16])0x400000000000000) !=
        (undefined1  [16])0x0) {
      pGVar5 = rapidjson::
               GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
               ::operator[]<char_const>
                         ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                           *)obj,"ipAddress");
      pCVar6 = rapidjson::
               GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               ::GetString(pGVar5);
      pcVar2 = (char *)(endpoint->IpAddress)._M_string_length;
      strlen(pCVar6);
      std::__cxx11::string::_M_replace((ulong)endpoint,0,pcVar2,(ulong)pCVar6);
    }
  }
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  FindMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              *)&local_30,(Ch *)obj);
  CVar3.value_ = (ValueType *)local_30;
  NVar4.i = (I)rapidjson::
               GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               ::MemberEnd(obj);
  if (CVar3.value_ != (ValueType *)NVar4.i64) {
    pGVar5 = rapidjson::
             GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
             ::operator[]<char_const>
                       ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                         *)obj,"serverName");
    if ((undefined1  [16])((undefined1  [16])pGVar5->data_ & (undefined1  [16])0x400000000000000) !=
        (undefined1  [16])0x0) {
      pGVar5 = rapidjson::
               GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
               ::operator[]<char_const>
                         ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                           *)obj,"serverName");
      pCVar6 = rapidjson::
               GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               ::GetString(pGVar5);
      pcVar2 = (char *)(endpoint->ServerName)._M_string_length;
      strlen(pCVar6);
      std::__cxx11::string::_M_replace((ulong)&endpoint->ServerName,0,pcVar2,(ulong)pCVar6);
    }
  }
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  FindMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              *)&local_30,(Ch *)obj);
  CVar3.value_ = (ValueType *)local_30;
  NVar4.i = (I)rapidjson::
               GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               ::MemberEnd(obj);
  if (CVar3.value_ != (ValueType *)NVar4.i64) {
    pGVar5 = rapidjson::
             GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
             ::operator[]<char_const>
                       ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                         *)obj,"statusMessage");
    if ((undefined1  [16])((undefined1  [16])pGVar5->data_ & (undefined1  [16])0x400000000000000) !=
        (undefined1  [16])0x0) {
      pGVar5 = rapidjson::
               GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
               ::operator[]<char_const>
                         ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                           *)obj,"statusMessage");
      pCVar6 = rapidjson::
               GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               ::GetString(pGVar5);
      pcVar2 = (char *)(endpoint->StatusMessage)._M_string_length;
      strlen(pCVar6);
      std::__cxx11::string::_M_replace((ulong)&endpoint->StatusMessage,0,pcVar2,(ulong)pCVar6);
    }
  }
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  FindMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              *)&local_30,(Ch *)obj);
  CVar3.value_ = (ValueType *)local_30;
  NVar4.i = (I)rapidjson::
               GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               ::MemberEnd(obj);
  if (CVar3.value_ != (ValueType *)NVar4.i64) {
    pGVar5 = rapidjson::
             GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
             ::operator[]<char_const>
                       ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                         *)obj,"statusDetailsMessage");
    if ((undefined1  [16])((undefined1  [16])pGVar5->data_ & (undefined1  [16])0x400000000000000) !=
        (undefined1  [16])0x0) {
      pGVar5 = rapidjson::
               GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
               ::operator[]<char_const>
                         ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                           *)obj,"statusDetailsMessage");
      pCVar6 = rapidjson::
               GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               ::GetString(pGVar5);
      pcVar2 = (char *)(endpoint->StatusDetailMessage)._M_string_length;
      strlen(pCVar6);
      std::__cxx11::string::_M_replace((ulong)&endpoint->StatusDetailMessage,0,pcVar2,(ulong)pCVar6)
      ;
    }
  }
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  FindMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              *)&local_30,(Ch *)obj);
  CVar3.value_ = (ValueType *)local_30;
  NVar4.i = (I)rapidjson::
               GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               ::MemberEnd(obj);
  if (CVar3.value_ != (ValueType *)NVar4.i64) {
    pGVar5 = rapidjson::
             GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
             ::operator[]<char_const>
                       ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                         *)obj,"grade");
    if ((undefined1  [16])((undefined1  [16])pGVar5->data_ & (undefined1  [16])0x400000000000000) !=
        (undefined1  [16])0x0) {
      pGVar5 = rapidjson::
               GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
               ::operator[]<char_const>
                         ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                           *)obj,"grade");
      pCVar6 = rapidjson::
               GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               ::GetString(pGVar5);
      pcVar2 = (char *)(endpoint->Grade)._M_string_length;
      strlen(pCVar6);
      std::__cxx11::string::_M_replace((ulong)&endpoint->Grade,0,pcVar2,(ulong)pCVar6);
    }
  }
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  FindMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              *)&local_30,(Ch *)obj);
  CVar3.value_ = (ValueType *)local_30;
  NVar4.i = (I)rapidjson::
               GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               ::MemberEnd(obj);
  if (CVar3.value_ != (ValueType *)NVar4.i64) {
    pGVar5 = rapidjson::
             GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
             ::operator[]<char_const>
                       ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                         *)obj,"gradeTrustIgnored");
    if ((undefined1  [16])((undefined1  [16])pGVar5->data_ & (undefined1  [16])0x400000000000000) !=
        (undefined1  [16])0x0) {
      pGVar5 = rapidjson::
               GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
               ::operator[]<char_const>
                         ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                           *)obj,"gradeTrustIgnored");
      pCVar6 = rapidjson::
               GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               ::GetString(pGVar5);
      pcVar2 = (char *)(endpoint->GradeTrustIgnored)._M_string_length;
      strlen(pCVar6);
      std::__cxx11::string::_M_replace((ulong)&endpoint->GradeTrustIgnored,0,pcVar2,(ulong)pCVar6);
    }
  }
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  FindMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              *)&local_30,(Ch *)obj);
  CVar3.value_ = (ValueType *)local_30;
  NVar4.i = (I)rapidjson::
               GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               ::MemberEnd(obj);
  if (CVar3.value_ != (ValueType *)NVar4.i64) {
    pGVar5 = rapidjson::
             GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
             ::operator[]<char_const>
                       ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                         *)obj,"hasWarnings");
    if ((undefined1  [16])((undefined1  [16])pGVar5->data_ & (undefined1  [16])0x8000000000000) !=
        (undefined1  [16])0x0) {
      pGVar5 = rapidjson::
               GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
               ::operator[]<char_const>
                         ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                           *)obj,"hasWarnings");
      uVar1 = (pGVar5->data_).f.flags;
      if ((uVar1 & 8) == 0) goto LAB_0010d737;
      endpoint->HasWarnings = uVar1 == 10;
    }
  }
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  FindMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              *)&local_30,(Ch *)obj);
  CVar3.value_ = (ValueType *)local_30;
  NVar4.i = (I)rapidjson::
               GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               ::MemberEnd(obj);
  if (CVar3.value_ != (ValueType *)NVar4.i64) {
    pGVar5 = rapidjson::
             GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
             ::operator[]<char_const>
                       ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                         *)obj,"isExceptional");
    if ((undefined1  [16])((undefined1  [16])pGVar5->data_ & (undefined1  [16])0x8000000000000) !=
        (undefined1  [16])0x0) {
      pGVar5 = rapidjson::
               GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
               ::operator[]<char_const>
                         ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                           *)obj,"isExceptional");
      uVar1 = (pGVar5->data_).f.flags;
      if ((uVar1 & 8) == 0) {
LAB_0010d737:
        __assert_fail("IsBool()",
                      "/workspace/llm4binary/github/license_c_cmakelists/matusso[P]libssllabs/src/../include/rapidjson/include/rapidjson/document.h"
                      ,0x498,
                      "bool rapidjson::GenericValue<rapidjson::UTF8<>>::GetBool() const [Encoding = rapidjson::UTF8<>, Allocator = rapidjson::MemoryPoolAllocator<>]"
                     );
      }
      endpoint->IsExceptional = uVar1 == 10;
    }
  }
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  FindMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              *)&local_30,(Ch *)obj);
  CVar3.value_ = (ValueType *)local_30;
  NVar4.i = (I)rapidjson::
               GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               ::MemberEnd(obj);
  if (CVar3.value_ != (ValueType *)NVar4.i64) {
    pGVar5 = rapidjson::
             GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
             ::operator[]<char_const>
                       ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                         *)obj,"progress");
    if ((undefined1  [16])((undefined1  [16])pGVar5->data_ & (undefined1  [16])0x20000000000000) !=
        (undefined1  [16])0x0) {
      pGVar5 = rapidjson::
               GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
               ::operator[]<char_const>
                         ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                           *)obj,"progress");
      if ((undefined1  [16])((undefined1  [16])pGVar5->data_ & (undefined1  [16])0x20000000000000)
          == (undefined1  [16])0x0) goto LAB_0010d718;
      endpoint->Progress = (pGVar5->data_).s.length;
    }
  }
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  FindMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              *)&local_30,(Ch *)obj);
  CVar3.value_ = (ValueType *)local_30;
  NVar4.i = (I)rapidjson::
               GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               ::MemberEnd(obj);
  if (CVar3.value_ != (ValueType *)NVar4.i64) {
    pGVar5 = rapidjson::
             GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
             ::operator[]<char_const>
                       ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                         *)obj,"duration");
    if ((undefined1  [16])((undefined1  [16])pGVar5->data_ & (undefined1  [16])0x20000000000000) !=
        (undefined1  [16])0x0) {
      pGVar5 = rapidjson::
               GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
               ::operator[]<char_const>
                         ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                           *)obj,"duration");
      if ((undefined1  [16])((undefined1  [16])pGVar5->data_ & (undefined1  [16])0x20000000000000)
          == (undefined1  [16])0x0) goto LAB_0010d718;
      endpoint->Duration = (pGVar5->data_).s.length;
    }
  }
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  FindMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              *)&local_30,(Ch *)obj);
  CVar3.value_ = (ValueType *)local_30;
  NVar4.i = (I)rapidjson::
               GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               ::MemberEnd(obj);
  if (CVar3.value_ != (ValueType *)NVar4.i64) {
    pGVar5 = rapidjson::
             GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
             ::operator[]<char_const>
                       ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                         *)obj,"eta");
    if ((undefined1  [16])((undefined1  [16])pGVar5->data_ & (undefined1  [16])0x20000000000000) !=
        (undefined1  [16])0x0) {
      pGVar5 = rapidjson::
               GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
               ::operator[]<char_const>
                         ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                           *)obj,"eta");
      if ((undefined1  [16])((undefined1  [16])pGVar5->data_ & (undefined1  [16])0x20000000000000)
          == (undefined1  [16])0x0) goto LAB_0010d718;
      endpoint->Eta = (pGVar5->data_).s.length;
    }
  }
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  FindMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              *)&local_30,(Ch *)obj);
  CVar3.value_ = (ValueType *)local_30;
  NVar4.i = (I)rapidjson::
               GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               ::MemberEnd(obj);
  if (CVar3.value_ != (ValueType *)NVar4.i64) {
    pGVar5 = rapidjson::
             GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
             ::operator[]<char_const>
                       ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                         *)obj,"delegation");
    if ((undefined1  [16])((undefined1  [16])pGVar5->data_ & (undefined1  [16])0x20000000000000) !=
        (undefined1  [16])0x0) {
      pGVar5 = rapidjson::
               GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
               ::operator[]<char_const>
                         ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                           *)obj,"delegation");
      if ((undefined1  [16])((undefined1  [16])pGVar5->data_ & (undefined1  [16])0x20000000000000)
          == (undefined1  [16])0x0) {
LAB_0010d718:
        __assert_fail("data_.f.flags & kIntFlag",
                      "/workspace/llm4binary/github/license_c_cmakelists/matusso[P]libssllabs/src/../include/rapidjson/include/rapidjson/document.h"
                      ,0x719,
                      "int rapidjson::GenericValue<rapidjson::UTF8<>>::GetInt() const [Encoding = rapidjson::UTF8<>, Allocator = rapidjson::MemoryPoolAllocator<>]"
                     );
      }
      endpoint->Delegation = (pGVar5->data_).s.length;
    }
  }
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  FindMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              *)&local_30,(Ch *)obj);
  NVar4.i = (I)rapidjson::
               GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               ::MemberEnd(obj);
  if (local_30.value_ != (ValueType *)NVar4.i64) {
    pGVar5 = rapidjson::
             GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
             ::operator[]<char_const>
                       ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                         *)obj,"details");
    if ((pGVar5->data_).f.flags == 3) {
      local_30.value_ =
           rapidjson::
           GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
           ::operator[]<char_const>
                     ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                       *)obj,"details");
      if (*(short *)((long)local_30.value_ + 0xe) != 3) {
        __assert_fail("IsObject()",
                      "/workspace/llm4binary/github/license_c_cmakelists/matusso[P]libssllabs/src/../include/rapidjson/include/rapidjson/document.h"
                      ,0x65e,
                      "ConstObject rapidjson::GenericValue<rapidjson::UTF8<>>::GetObject() const [Encoding = rapidjson::UTF8<>, Allocator = rapidjson::MemoryPoolAllocator<>]"
                     );
      }
      parseEndpointDetails(&local_30,endpoint);
    }
  }
  return;
}

Assistant:

void Endpoint::parseEndpointData(const rapidjson::GenericValue<rapidjson::UTF8<char>,
            rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>> &obj, labsEndpoint_t &endpoint) {
        if (obj.HasMember("ipAddress") && obj["ipAddress"].IsString()) {
            endpoint.IpAddress.assign(obj["ipAddress"].GetString());
        }

        if (obj.HasMember("serverName") && obj["serverName"].IsString()) {
            endpoint.ServerName.assign(obj["serverName"].GetString());
        }

        if (obj.HasMember("statusMessage") && obj["statusMessage"].IsString()) {
            endpoint.StatusMessage.assign(obj["statusMessage"].GetString());
        }

        if (obj.HasMember("statusDetailsMessage") && obj["statusDetailsMessage"].IsString()) {
            endpoint.StatusDetailMessage.assign(obj["statusDetailsMessage"].GetString());
        }

        if (obj.HasMember("grade") && obj["grade"].IsString()) {
            endpoint.Grade.assign(obj["grade"].GetString());
        }

        if (obj.HasMember("gradeTrustIgnored") && obj["gradeTrustIgnored"].IsString()) {
            endpoint.GradeTrustIgnored.assign(obj["gradeTrustIgnored"].GetString());
        }

        if (obj.HasMember("hasWarnings") && obj["hasWarnings"].IsBool()) {
            endpoint.HasWarnings = obj["hasWarnings"].GetBool();
        }

        if (obj.HasMember("isExceptional") && obj["isExceptional"].IsBool()) {
            endpoint.IsExceptional = obj["isExceptional"].GetBool();
        }

        if (obj.HasMember("progress") && obj["progress"].IsInt()) {
            endpoint.Progress = obj["progress"].GetInt();
        }

        if (obj.HasMember("duration") && obj["duration"].IsInt()) {
            endpoint.Duration = obj["duration"].GetInt();
        }

        if (obj.HasMember("eta") && obj["eta"].IsInt()) {
            endpoint.Eta = obj["eta"].GetInt();
        }

        if (obj.HasMember("delegation") && obj["delegation"].IsInt()) {
            endpoint.Delegation = obj["delegation"].GetInt();
        }

        if (obj.HasMember("details") && obj["details"].IsObject()) {
            parseEndpointDetails(obj["details"].GetObject(), endpoint);
        }

        return;
    }